

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O2

aiReturn aiGetMaterialIntegerArray
                   (aiMaterial *pMat,char *pKey,uint type,uint index,int *pOut,uint *pMax)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Logger *this;
  uint uVar4;
  ulong uVar5;
  aiReturn aVar6;
  ulong uVar7;
  allocator local_b1;
  char *cur;
  ulong local_a8;
  uint *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  aiMaterialProperty *prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (pOut == (int *)0x0) {
    __assert_fail("pOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                  ,0xbb,
                  "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
                 );
  }
  if (pMat != (aiMaterial *)0x0) {
    aiGetMaterialProperty(pMat,pKey,type,index,&prop);
    aVar6 = aiReturn_FAILURE;
    if (prop != (aiMaterialProperty *)0x0) {
      if (prop->mType - aiPTI_Integer < 2) {
        uVar1 = prop->mDataLength;
        uVar5 = 1;
        if (3 < uVar1) {
          uVar5 = (ulong)(uVar1 >> 2);
        }
        if ((pMax != (uint *)0x0) && (*pMax <= (uint)uVar5)) {
          uVar5 = (ulong)*pMax;
        }
        uVar4 = (uint)uVar5;
        if (uVar1 == 1) {
          *pOut = (int)*prop->mData;
        }
        else {
          for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
            pOut[uVar7] = *(int *)(prop->mData + uVar7 * 4);
          }
        }
      }
      else {
        if (prop->mType != aiPTI_Float) {
          if (pMax == (uint *)0x0) {
            local_a8 = 0;
          }
          else {
            local_a8 = (ulong)*pMax;
          }
          cur = prop->mData + 4;
          if (4 < prop->mDataLength) {
            local_a0 = pMax;
            if (prop->mData[prop->mDataLength - 1] != '\0') {
              __assert_fail("!prop->mData[ prop->mDataLength - 1 ]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                            ,0xed,
                            "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
                           );
            }
            iVar2 = (int)local_a8;
            uVar5 = 0;
            while( true ) {
              iVar3 = Assimp::strtol10(cur,&cur);
              pOut[uVar5] = iVar3;
              if (iVar2 - 1 == uVar5) {
                if (local_a0 != (uint *)0x0) {
                  *local_a0 = (uint)local_a8;
                }
                return aiReturn_SUCCESS;
              }
              if ((*cur != '\t') && (*cur != ' ')) break;
              uVar5 = uVar5 + 1;
            }
            this = Assimp::DefaultLogger::get();
            std::__cxx11::string::string((string *)&local_50,pKey,&local_b1);
            std::operator+(&local_98,"Material property",&local_50);
            std::operator+(&local_78,&local_98,
                           " is a string; failed to parse an integer array out of it.");
            Assimp::Logger::error(this,local_78._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&local_50);
            return aiReturn_FAILURE;
          }
          __assert_fail("prop->mDataLength >= 5",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                        ,0xec,
                        "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
                       );
        }
        uVar4 = prop->mDataLength >> 2;
        uVar5 = (ulong)uVar4;
        if (pMax != (uint *)0x0) {
          uVar5 = (ulong)uVar4;
          if (*pMax <= uVar4) {
            uVar5 = (ulong)*pMax;
          }
        }
        uVar4 = (uint)uVar5;
        for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
          pOut[uVar7] = (int)*(float *)(prop->mData + uVar7 * 4);
        }
      }
      aVar6 = aiReturn_SUCCESS;
      if (pMax != (uint *)0x0) {
        *pMax = uVar4;
        aVar6 = aiReturn_SUCCESS;
      }
    }
    return aVar6;
  }
  __assert_fail("pMat != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                ,0xbc,
                "aiReturn aiGetMaterialIntegerArray(const aiMaterial *, const char *, unsigned int, unsigned int, int *, unsigned int *)"
               );
}

Assistant:

aiReturn aiGetMaterialIntegerArray(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    int* pOut,
    unsigned int* pMax)
{
    ai_assert( pOut != NULL );
    ai_assert( pMat != NULL );

    const aiMaterialProperty* prop;
    aiGetMaterialProperty(pMat,pKey,type,index,(const aiMaterialProperty**) &prop);
    if (!prop) {
        return AI_FAILURE;
    }

    // data is given in ints, simply copy it
    unsigned int iWrite = 0;
    if( aiPTI_Integer == prop->mType || aiPTI_Buffer == prop->mType)    {
        iWrite = std::max(static_cast<unsigned int>(prop->mDataLength / sizeof(int32_t)), 1u);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite);
        }
        if (1 == prop->mDataLength) {
            // bool type, 1 byte
            *pOut = static_cast<int>(*prop->mData);
        }
        else {
            for (unsigned int a = 0; a < iWrite;++a) {
                pOut[a] = static_cast<int>(reinterpret_cast<int32_t*>(prop->mData)[a]);
            }
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // data is given in floats convert to int
    else if( aiPTI_Float == prop->mType)    {
        iWrite = prop->mDataLength / sizeof(float);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }
        for (unsigned int a = 0; a < iWrite;++a) {
            pOut[a] = static_cast<int>(reinterpret_cast<float*>(prop->mData)[a]);
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // it is a string ... no way to read something out of this
    else    {
        if (pMax) {
            iWrite = *pMax;
        }
        // strings are zero-terminated with a 32 bit length prefix, so this is safe
        const char *cur =  prop->mData+4;
        ai_assert( prop->mDataLength >= 5 );
        ai_assert( !prop->mData[ prop->mDataLength - 1 ] );
        for (unsigned int a = 0; ;++a) {
            pOut[a] = strtol10(cur,&cur);
            if(a==iWrite-1) {
                break;
            }
            if(!IsSpace(*cur)) {
                ASSIMP_LOG_ERROR("Material property" + std::string(pKey) +
                    " is a string; failed to parse an integer array out of it.");
                return AI_FAILURE;
            }
        }

        if (pMax) {
            *pMax = iWrite;
        }
    }
    return AI_SUCCESS;
}